

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_tests2.cpp
# Opt level: O2

int My2_x_iutest_x_MultiInstantiateParamTest_TestSuiteInstantiationRegister(void)

{
  int iVar1;
  UnitTest *pUVar2;
  ParamTestSuiteInfo<MultiInstantiateParamTest> *this;
  allocator<char> local_69;
  string local_68;
  string local_48;
  string local_28;
  
  pUVar2 = iutest::UnitTest::instance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"MultiInstantiateParamTest",&local_69);
  iutest::detail::package_name_server<iuTest_TestSuitePackage>::getname_abi_cxx11_();
  this = iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<MultiInstantiateParamTest>
                   (&pUVar2->m_param_testsuite_holder,&local_68,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"My2",(allocator<char> *)&local_68);
  iVar1 = iutest::detail::ParamTestSuiteInfo<MultiInstantiateParamTest>::AddTestSuiteInstantiation
                    (this,&local_48,s_My2_x_iutest_x_MultiInstantiateParamTest_EvalGenerator_,
                     s_My2_x_iutest_x_MultiInstantiateParamTest_ParamGenerator__abi_cxx11_,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/param_test_tests2.cpp"
                     ,0x17);
  std::__cxx11::string::~string((string *)&local_48);
  return iVar1;
}

Assistant:

IUTEST_P(TypeConversionParamTest, Test)
{
}